

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getFrameFreeFloatingJacobian
          (KinDynComputations *this,FrameIndex frameIndex,MatrixDynSize *outJacobian)

{
  pointer peVar1;
  index_type iVar2;
  bool bVar3;
  MatrixView<double> local_58;
  
  peVar1 = (pointer)iDynTree::MatrixDynSize::data();
  iVar2 = iDynTree::MatrixDynSize::rows();
  local_58.m_cols = iDynTree::MatrixDynSize::cols();
  local_58.m_storageOrder = RowMajor;
  local_58.m_innerStride = 1;
  local_58.m_storage = peVar1;
  local_58.m_rows = iVar2;
  local_58.m_outerStride = local_58.m_cols;
  bVar3 = getFrameFreeFloatingJacobian(this,frameIndex,&local_58);
  return bVar3;
}

Assistant:

bool KinDynComputations::getFrameFreeFloatingJacobian(const FrameIndex frameIndex,
                                                      MatrixDynSize& outJacobian)
{
    return getFrameFreeFloatingJacobian(frameIndex, MatrixView<double>(outJacobian));
}